

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::~RE2(RE2 *this)

{
  string *this_00;
  string *in_RDI;
  Regexp *in_stack_00000020;
  Prog *in_stack_ffffffffffffffd0;
  void *pvVar1;
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    Regexp::Decref(in_stack_00000020);
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    Regexp::Decref(in_stack_00000020);
  }
  pvVar1 = *(void **)(in_RDI + 0x70);
  if (pvVar1 != (void *)0x0) {
    Prog::~Prog(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1);
  }
  pvVar1 = *(void **)(in_RDI + 0x80);
  if (pvVar1 != (void *)0x0) {
    Prog::~Prog(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1);
  }
  if ((*(long *)(in_RDI + 0x88) != empty_string_abi_cxx11_) &&
     (this_00 = *(string **)(in_RDI + 0x88), this_00 != (string *)0x0)) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  if (((*(long *)(in_RDI + 0xb8) != 0) &&
      (*(long *)(in_RDI + 0xb8) != empty_named_groups_abi_cxx11_)) &&
     (pvVar1 = *(void **)(in_RDI + 0xb8), pvVar1 != (void *)0x0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x21ed64);
    operator_delete(pvVar1);
  }
  if (((*(long *)(in_RDI + 0xc0) != 0) && (*(long *)(in_RDI + 0xc0) != empty_group_names_abi_cxx11_)
      ) && (pvVar1 = *(void **)(in_RDI + 0xc0), pvVar1 != (void *)0x0)) {
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x21edb3);
    operator_delete(pvVar1);
  }
  std::__cxx11::string::~string(in_RDI + 0x98);
  std::__cxx11::string::~string(in_RDI + 0x38);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

RE2::~RE2() {
  if (suffix_regexp_)
    suffix_regexp_->Decref();
  if (entire_regexp_)
    entire_regexp_->Decref();
  delete prog_;
  delete rprog_;
  if (error_ != empty_string)
    delete error_;
  if (named_groups_ != NULL && named_groups_ != empty_named_groups)
    delete named_groups_;
  if (group_names_ != NULL &&  group_names_ != empty_group_names)
    delete group_names_;
}